

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_one_block_simd
                  (working_state *state,JCOEFPTR block,int last_dc_val,c_derived_tbl *dctbl,
                  c_derived_tbl *actbl)

{
  bool bVar1;
  boolean bVar2;
  JOCTET *pJVar3;
  ulong uVar4;
  undefined1 *puVar5;
  long *in_RDI;
  size_t bytestocopy;
  size_t bytes;
  int localbuf;
  JOCTET *buffer;
  JOCTET _buffer [512];
  c_derived_tbl *in_stack_fffffffffffffd98;
  c_derived_tbl *in_stack_fffffffffffffda0;
  size_t __n;
  undefined8 in_stack_fffffffffffffda8;
  JCOEFPTR in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  uint uVar6;
  undefined1 local_238 [552];
  long *local_10;
  
  if (0x1ffU < (ulong)in_RDI[1]) {
    puVar5 = (undefined1 *)*in_RDI;
  }
  else {
    puVar5 = local_238;
  }
  bVar1 = 0x1ffU >= (ulong)in_RDI[1];
  uVar6 = (uint)bVar1;
  local_10 = in_RDI;
  pJVar3 = jsimd_huff_encode_one_block
                     (puVar5,(JOCTET *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffdb8),
                      in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                      in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (uVar6 == 0) {
    local_10[1] = local_10[1] - ((long)pJVar3 - *local_10);
    *local_10 = (long)pJVar3;
  }
  else {
    puVar5 = local_238;
    for (uVar4 = (long)pJVar3 - (long)local_238; uVar4 != 0; uVar4 = uVar4 - __n) {
      __n = uVar4;
      if ((ulong)local_10[1] <= uVar4) {
        __n = local_10[1];
      }
      memcpy((void *)*local_10,puVar5,__n);
      *local_10 = __n + *local_10;
      puVar5 = puVar5 + __n;
      local_10[1] = local_10[1] - __n;
      if ((local_10[1] == 0) &&
         (bVar2 = dump_buffer((working_state *)in_stack_fffffffffffffd98), bVar2 == 0)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

LOCAL(boolean)
encode_one_block_simd(working_state *state, JCOEFPTR block, int last_dc_val,
                      c_derived_tbl *dctbl, c_derived_tbl *actbl)
{
  JOCTET _buffer[BUFSIZE], *buffer;
  int localbuf = 0;

  LOAD_BUFFER()

  buffer = jsimd_huff_encode_one_block(state, buffer, block, last_dc_val,
                                       dctbl, actbl);

  STORE_BUFFER()

  return TRUE;
}